

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O2

void luaX_setinput(lua_State *L,LexState *ls,ZIO *z,TString *source,int firstchar)

{
  Mbuffer *pMVar1;
  TString *pTVar2;
  char *pcVar3;
  
  (ls->t).token = 0;
  ls->L = L;
  ls->current = firstchar;
  (ls->lookahead).token = 0x121;
  ls->z = z;
  ls->fs = (FuncState *)0x0;
  ls->linenumber = 1;
  ls->lastline = 1;
  ls->source = source;
  pTVar2 = luaS_newlstr(L,"_ENV",4);
  ls->envn = pTVar2;
  pcVar3 = (char *)luaM_realloc_(ls->L,ls->buff->buffer,ls->buff->buffsize,0x20);
  pMVar1 = ls->buff;
  pMVar1->buffer = pcVar3;
  pMVar1->buffsize = 0x20;
  return;
}

Assistant:

void luaX_setinput (lua_State *L, LexState *ls, ZIO *z, TString *source,
                    int firstchar) {
  ls->t.token = 0;
  ls->L = L;
  ls->current = firstchar;
  ls->lookahead.token = TK_EOS;  /* no look-ahead token */
  ls->z = z;
  ls->fs = NULL;
  ls->linenumber = 1;
  ls->lastline = 1;
  ls->source = source;
  ls->envn = luaS_newliteral(L, LUA_ENV);  /* get env name */
  luaZ_resizebuffer(ls->L, ls->buff, LUA_MINBUFFER);  /* initialize buffer */
}